

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

Font * __thiscall sf::Font::operator=(Font *this,Font *right)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  pointer puVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  pointer puVar8;
  pointer puVar9;
  size_type *local_d8;
  size_type local_d0;
  size_type local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [72];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  local_70;
  pointer local_40;
  pointer puStack_38;
  pointer local_30;
  
  Font((Font *)local_b8,right);
  pvVar4 = this->m_library;
  pvVar5 = this->m_face;
  this->m_library = (void *)local_b8._0_8_;
  this->m_face = (void *)local_b8._8_8_;
  pvVar6 = this->m_streamRec;
  pvVar7 = this->m_stroker;
  this->m_streamRec = (void *)local_b8._16_8_;
  this->m_stroker = (void *)local_b8._24_8_;
  piVar2 = this->m_refCount;
  this->m_refCount = (int *)local_b8._32_8_;
  local_d8 = (size_type *)(this->m_info).family._M_dataplus._M_p;
  paVar1 = &(this->m_info).family.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8 == paVar1) {
    local_c8 = paVar1->_M_allocated_capacity;
    uStack_c0 = *(undefined8 *)((long)&(this->m_info).family.field_2 + 8);
    local_d8 = &local_c8;
  }
  else {
    local_c8 = paVar1->_M_allocated_capacity;
  }
  local_d0 = (this->m_info).family._M_string_length;
  (this->m_info).family._M_dataplus._M_p = (pointer)paVar1;
  (this->m_info).family._M_string_length = 0;
  (this->m_info).family.field_2._M_local_buf[0] = '\0';
  local_b8._0_8_ = pvVar4;
  local_b8._8_8_ = pvVar5;
  local_b8._16_8_ = pvVar6;
  local_b8._24_8_ = pvVar7;
  local_b8._32_8_ = piVar2;
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)(local_b8 + 0x28));
  std::__cxx11::string::operator=((string *)(local_b8 + 0x28),(string *)&local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::swap(&(this->m_pages)._M_t,&local_70);
  puVar3 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_30;
  puVar8 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = local_40;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_38;
  local_40 = puVar8;
  puStack_38 = puVar9;
  local_30 = puVar3;
  ~Font((Font *)local_b8);
  return this;
}

Assistant:

Font& Font::operator =(const Font& right)
{
    Font temp(right);

    std::swap(m_library,     temp.m_library);
    std::swap(m_face,        temp.m_face);
    std::swap(m_streamRec,   temp.m_streamRec);
    std::swap(m_stroker,     temp.m_stroker);
    std::swap(m_refCount,    temp.m_refCount);
    std::swap(m_info,        temp.m_info);
    std::swap(m_pages,       temp.m_pages);
    std::swap(m_pixelBuffer, temp.m_pixelBuffer);

    #ifdef SFML_SYSTEM_ANDROID
        std::swap(m_stream, temp.m_stream);
    #endif

    return *this;
}